

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O1

ObjectFormatType getDefaultFormat(Triple *T)

{
  OSType OVar1;
  ObjectFormatType OVar2;
  
  OVar2 = ELF;
  switch(T->Arch) {
  case UnknownArch:
  case arm:
  case aarch64:
  case thumb:
  case x86:
  case x86_64:
    OVar1 = T->OS;
    OVar2 = MachO;
    if (((OVar1 & ~KFreeBSD) != Darwin) &&
       ((WatchOS < OVar1 || ((0x18000080U >> (OVar1 & AMDPAL) & 1) == 0)))) {
      return (OVar1 != Win32) + COFF;
    }
    break;
  case armeb:
  case aarch64_be:
  case arc:
  case avr:
  case bpfel:
  case bpfeb:
  case hexagon:
  case mips:
  case mipsel:
  case mips64:
  case mips64el:
  case msp430:
  case nios2:
  case ppc64le:
  case r600:
  case amdgcn:
  case riscv32:
  case riscv64:
  case sparc:
  case sparcv9:
  case sparcel:
  case systemz:
  case tce:
  case tcele:
  case thumbeb:
  case xcore:
  case nvptx:
  case nvptx64:
  case le32:
  case le64:
  case amdil:
  case amdil64:
  case hsail:
  case hsail64:
  case spir:
  case spir64:
  case kalimba:
  case shave:
  case lanai:
  case renderscript32:
  case LastArchType:
    break;
  case ppc:
  case ppc64:
    OVar1 = T->OS;
    OVar2 = MachO;
    if (((OVar1 & ~KFreeBSD) != Darwin) &&
       ((WatchOS < OVar1 || ((0x18000080U >> (OVar1 & AMDPAL) & 1) == 0)))) {
      return ELF;
    }
    break;
  case wasm32:
  case wasm64:
    return Wasm;
  default:
    llvm::llvm_unreachable_internal
              ("unknown architecture",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x2ae);
  }
  return OVar2;
}

Assistant:

ArchType getArch() const { return Arch; }